

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O0

void __thiscall QFontComboBox::QFontComboBox(QFontComboBox *this,QWidget *parent)

{
  QComboBox *this_00;
  QFontComboBoxPrivate *pQVar1;
  QFont *pQVar2;
  QStringListModel *this_01;
  Object *sender;
  QFontComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QListView *lview;
  QStringListModel *m;
  QFontComboBoxPrivate *d;
  undefined8 in_stack_ffffffffffffff38;
  undefined1 enable;
  QFontComboBoxPrivate *in_stack_ffffffffffffff40;
  QComboBox *in_stack_ffffffffffffff48;
  WritingSystem script;
  array<QMetaObject::Connection,_2UL> *paVar3;
  uint in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar4;
  QComboBoxPrivate *in_stack_ffffffffffffff58;
  undefined1 editable;
  QComboBox *in_stack_ffffffffffffff68;
  QObject *in_stack_ffffffffffffff80;
  QFontFamilyDelegate *in_stack_ffffffffffffff88;
  ConnectionType type;
  Object *receiverPrivate;
  QFontComboBoxPrivate *slot;
  offset_in_QComboBox_to_subr in_stack_ffffffffffffffd0;
  array<QMetaObject::Connection,_2UL> local_10;
  
  enable = (undefined1)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  local_10._M_elems[1].d_ptr = *(void **)(in_FS_OFFSET + 0x28);
  slot = in_RDI;
  this_00 = (QComboBox *)operator_new(0x390);
  QFontComboBoxPrivate::QFontComboBoxPrivate(in_stack_ffffffffffffff40);
  QComboBox::QComboBox
            (this_00,in_stack_ffffffffffffff58,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  editable = (undefined1)((ulong)this_00 >> 0x38);
  *(undefined ***)&(in_RDI->super_QComboBoxPrivate).super_QWidgetPrivate = &PTR_metaObject_00d13cc0;
  *(undefined ***)&(in_RDI->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x10 =
       &PTR__QFontComboBox_00d13e90;
  pQVar1 = d_func((QFontComboBox *)0x59a290);
  pQVar2 = QWidget::font((QWidget *)in_RDI);
  QFont::operator=(&pQVar1->currentFont,pQVar2);
  QComboBox::setEditable(in_stack_ffffffffffffff68,(bool)editable);
  this_01 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_01,(QObject *)in_RDI);
  (**(code **)(*(long *)&(in_RDI->super_QComboBoxPrivate).super_QWidgetPrivate + 0x1a0))
            (in_RDI,this_01);
  operator_new(0x30);
  QFontFamilyDelegate::QFontFamilyDelegate
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_RDI);
  QComboBox::setItemDelegate
            (in_stack_ffffffffffffff48,(QAbstractItemDelegate *)in_stack_ffffffffffffff40);
  script = (WritingSystem)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  QComboBox::view((QComboBox *)in_stack_ffffffffffffff40);
  sender = (Object *)qobject_cast<QListView*>((QObject *)0x59a33d);
  if (sender != (Object *)0x0) {
    QListView::setUniformItemSizes((QListView *)in_stack_ffffffffffffff40,(bool)enable);
  }
  uVar4 = 0;
  setWritingSystem((QFontComboBox *)(ulong)in_stack_ffffffffffffff50,script);
  type = AutoConnection;
  receiverPrivate = (Object *)0x0;
  QObjectPrivate::
  connect<void(QComboBox::*)(QString_const&),void(QFontComboBoxPrivate::*)(QString_const&)>
            ((Object *)sender,in_stack_ffffffffffffffd0,(Object *)0x0,(Function)slot,AutoConnection)
  ;
  paVar3 = &local_10;
  QCoreApplication::instance();
  QObjectPrivate::connect<void(QGuiApplication::*)(),void(QFontComboBoxPrivate::*)()>
            (sender,0,receiverPrivate,(Function)slot,type);
  std::array<QMetaObject::Connection,_2UL>::operator=
            ((array<QMetaObject::Connection,_2UL> *)CONCAT44(uVar4,in_stack_ffffffffffffff50),paVar3
            );
  std::array<QMetaObject::Connection,_2UL>::~array
            ((array<QMetaObject::Connection,_2UL> *)CONCAT44(uVar4,in_stack_ffffffffffffff50));
  if (*(void **)(in_FS_OFFSET + 0x28) == local_10._M_elems[1].d_ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontComboBox::QFontComboBox(QWidget *parent)
    : QComboBox(*new QFontComboBoxPrivate, parent)
{
    Q_D(QFontComboBox);
    d->currentFont = font();
    setEditable(true);

    QStringListModel *m = new QStringListModel(this);
    setModel(m);
    setItemDelegate(new QFontFamilyDelegate(this, d));
    QListView *lview = qobject_cast<QListView*>(view());
    if (lview)
        lview->setUniformItemSizes(true);
    setWritingSystem(QFontDatabase::Any);

    d->connections = {
        QObjectPrivate::connect(this, &QFontComboBox::currentTextChanged,
                                d, &QFontComboBoxPrivate::currentChanged),
        QObjectPrivate::connect(qApp, &QGuiApplication::fontDatabaseChanged,
                                d, &QFontComboBoxPrivate::updateModel),
    };
}